

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_poly_vector.h
# Opt level: O0

void __thiscall Impl1::Impl1(Impl1 *this,Impl1 *o)

{
  int *__p;
  Impl1 *o_local;
  Impl1 *this_local;
  
  Interface::Interface(&this->super_Interface,&o->super_Interface);
  (this->super_Interface)._vptr_Interface = (_func_int **)&PTR_function_005cb588;
  this->d = o->d;
  __p = (int *)operator_new__(0x1bc);
  std::unique_ptr<int[],std::default_delete<int[]>>::
  unique_ptr<int*,std::default_delete<int[]>,void,bool>
            ((unique_ptr<int[],std::default_delete<int[]>> *)&this->p,__p);
  Cookie::Cookie(&this->cookie);
  Cookie::set(&this->cookie);
  return;
}

Assistant:

Impl1(Impl1&& o) noexcept
        : Interface(std::move(o))
        , d { o.d }
        , p { new int[111] }
    {
        cookie.set();
    }